

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O2

void draw_4_circles(Am_Drawonable *d)

{
  int iVar1;
  undefined1 *puVar2;
  long lVar3;
  Am_Style local_80 [8];
  Am_Style local_78 [8];
  Am_Style local_70 [8];
  Am_Style local_68 [8];
  Am_Style local_60 [8];
  Am_Style local_58 [8];
  Am_Style local_50 [8];
  Am_Style local_48 [8];
  long local_40;
  undefined1 *local_38;
  
  Am_Style::Am_Style(local_58,(Am_Style *)&black);
  Am_Style::Am_Style(local_60,(Am_Style *)&red);
  Am_Style::Am_Style(local_68,(Am_Style *)&black);
  Am_Style::Am_Style(local_70,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_78,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_80,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_48,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_50,(Am_Style *)&Am_No_Style);
  set_style_array(local_58,local_60,local_68,local_70,local_78,local_80,local_48,local_50);
  Am_Style::~Am_Style(local_50);
  Am_Style::~Am_Style(local_48);
  Am_Style::~Am_Style(local_80);
  Am_Style::~Am_Style(local_78);
  Am_Style::~Am_Style(local_70);
  Am_Style::~Am_Style(local_68);
  Am_Style::~Am_Style(local_60);
  Am_Style::~Am_Style(local_58);
  puVar2 = style_array;
  for (local_40 = 0; local_40 != 2; local_40 = local_40 + 1) {
    iVar1 = (int)local_40;
    local_38 = puVar2;
    for (lVar3 = -0x96; lVar3 != 0; lVar3 = lVar3 + 0x4b) {
      (**(code **)(*(long *)d + 0x130))
                (d,&Am_No_Style,puVar2,iVar1 * 0x4b + 10,(int)lVar3 + 0xa0,0x32,0x32,0,0x168,0,1);
      puVar2 = puVar2 + 8;
    }
    puVar2 = local_38 + 8;
  }
  return;
}

Assistant:

void
draw_4_circles(Am_Drawonable *d)
{
  int x_counter, y_counter, x, y;

  set_style_array(black, red, black);
  for (x_counter = 0; x_counter <= 1; x_counter++) {
    for (y_counter = 0; y_counter <= 1; y_counter++) {
      x = 10 + (75 * x_counter);
      y = 10 + (75 * y_counter);
      d->Draw_Arc(Am_No_Style, style_array[x_counter + y_counter], x, y, 50,
                  50);
    }
  }
}